

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

BasicBlock * __thiscall
wasm::
CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
::startBasicBlock(CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                  *this)

{
  BasicBlock *pBVar1;
  unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
  local_18;
  CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  *local_10;
  CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  *this_local;
  
  local_10 = this;
  pBVar1 = makeBasicBlock(this);
  this->currBasicBlock = pBVar1;
  std::
  unique_ptr<wasm::CFGWalker<wasm::analysis::CFG::fromFunction(wasm::Function*)::CFGBuilder,wasm::UnifiedExpressionVisitor<wasm::analysis::CFG::fromFunction(wasm::Function*)::CFGBuilder,void>,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>::BasicBlock,std::default_delete<wasm::CFGWalker<wasm::analysis::CFG::fromFunction(wasm::Function*)::CFGBuilder,wasm::UnifiedExpressionVisitor<wasm::analysis::CFG::fromFunction(wasm::Function*)::CFGBuilder,void>,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>::BasicBlock>>
  ::
  unique_ptr<std::default_delete<wasm::CFGWalker<wasm::analysis::CFG::fromFunction(wasm::Function*)::CFGBuilder,wasm::UnifiedExpressionVisitor<wasm::analysis::CFG::fromFunction(wasm::Function*)::CFGBuilder,void>,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>::BasicBlock>,void>
            ((unique_ptr<wasm::CFGWalker<wasm::analysis::CFG::fromFunction(wasm::Function*)::CFGBuilder,wasm::UnifiedExpressionVisitor<wasm::analysis::CFG::fromFunction(wasm::Function*)::CFGBuilder,void>,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>::BasicBlock,std::default_delete<wasm::CFGWalker<wasm::analysis::CFG::fromFunction(wasm::Function*)::CFGBuilder,wasm::UnifiedExpressionVisitor<wasm::analysis::CFG::fromFunction(wasm::Function*)::CFGBuilder,void>,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>::BasicBlock>>
              *)&local_18,this->currBasicBlock);
  std::
  vector<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>_>_>
  ::push_back(&this->basicBlocks,(value_type *)&local_18);
  std::
  unique_ptr<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock,_std::default_delete<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock>_>
  ::~unique_ptr(&local_18);
  return this->currBasicBlock;
}

Assistant:

BasicBlock* startBasicBlock() {
    currBasicBlock = ((SubType*)this)->makeBasicBlock();
    basicBlocks.push_back(std::unique_ptr<BasicBlock>(currBasicBlock));
    return currBasicBlock;
  }